

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::func_decl(analysis *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar4;
  string tmp_str;
  NodePtr tmp_ptr;
  undefined1 local_58 [20];
  int lineno;
  string local_40;
  
  token::getVal_abi_cxx11_
            (&tmp_str,(in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  local_58._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  std::make_shared<dh::TreeNode,std::__cxx11::string,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp_ptr,
             (int *)&tmp_str);
  std::__cxx11::string::~string((string *)&tmp_str);
  token::getVal_abi_cxx11_
            (&tmp_str,(in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  bVar1 = std::operator==(&tmp_str,"int");
  std::__cxx11::string::~string((string *)&tmp_str);
  if (bVar1) {
    tmp_str._M_dataplus._M_p._0_4_ = 2;
    TreeNode::setType(tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (int *)&tmp_str);
  }
  else {
    token::getVal_abi_cxx11_
              (&tmp_str,(in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    bVar1 = std::operator==(&tmp_str,"float");
    std::__cxx11::string::~string((string *)&tmp_str);
    if (bVar1) {
      tmp_str._M_dataplus._M_p._0_4_ = 3;
      TreeNode::setType(tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (int *)&tmp_str);
    }
    else {
      token::getVal_abi_cxx11_
                (&tmp_str,(in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      bVar1 = std::operator==(&tmp_str,"void");
      std::__cxx11::string::~string((string *)&tmp_str);
      if (bVar1) {
        tmp_str._M_dataplus._M_p._0_4_ = 4;
        TreeNode::setType(tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(int *)&tmp_str);
      }
      else {
        token::getVal_abi_cxx11_
                  (&tmp_str,(in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        bVar1 = std::operator==(&tmp_str,"boolean");
        std::__cxx11::string::~string((string *)&tmp_str);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Unexpected type \"");
          token::getVal_abi_cxx11_
                    (&tmp_str,(in_RSI->tmp).
                              super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar3 = std::operator<<(poVar3,(string *)&tmp_str);
          poVar3 = std::operator<<(poVar3,"\" in line ");
          iVar2 = token::getLineno((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&tmp_str);
          exit(1);
        }
        tmp_str._M_dataplus._M_p._0_4_ = 0;
        TreeNode::setType(tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(int *)&tmp_str);
      }
    }
  }
  token::getVal_abi_cxx11_
            (&local_40,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  match(in_RSI,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  lineno = token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
  identifier_abi_cxx11_(&tmp_str,in_RSI);
  std::make_shared<dh::TreeNode,std::__cxx11::string&,int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (int *)&tmp_str);
  local_58._0_4_ = 0;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_58);
  local_58._0_4_ = 0;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_58);
  TreeNode::appendChild(*(TreeNode **)this,&tmp_ptr);
  para_list((analysis *)local_58);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  TreeNode::appendChild
            (*(TreeNode **)this,
             (NodePtr *)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>);
  in_RSI->layer_record = in_RSI->layer_record + 1;
  compound_stmt((analysis *)local_58);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  in_RSI->layer_record = in_RSI->layer_record + -1;
  TreeNode::appendChild
            (*(TreeNode **)this,
             (NodePtr *)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::~string((string *)&tmp_str);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::func_decl()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in func_decl, get type " << tmp->getVal() << ::std::endl;
#endif
	
	NodePtr tmp_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
	if ( tmp->getVal() == "int")
	{
		tmp_ptr->setType(TypeKind::IntK);
	} else if ( tmp->getVal() == "float")
	{
		tmp_ptr->setType(TypeKind::FloatK); 
	} else if ( tmp->getVal() == "void")
	{
		tmp_ptr->setType(TypeKind::VoidK);
	} else if (tmp->getVal() == "boolean")
	{
		tmp_ptr->setType(TypeKind::BoolK);
	} else 
	{
		::std::cerr << "[ERROR] Unexpected type \""
			<< tmp->getVal() 
			<< "\" in line "
			<< tmp->getLineno()
			<< ::std::endl;
		::std::exit(1);
	}
	match(tmp->getVal());

	int lineno = tmp->getLineno();
	::std::string tmp_str = identifier();
	NodePtr ret = ::std::make_shared<TreeNode>(tmp_str,lineno);
	ret->setNodeKind(NodeKind::DeclK);
	ret->setKind(DeclKind::FuncK);
	ret->appendChild(tmp_ptr);

	tmp_ptr = para_list();
	ret->appendChild(tmp_ptr);

	this->layer_record++;
	tmp_ptr = compound_stmt();
	this->layer_record--;

	ret->appendChild(tmp_ptr);
	return ret;
}